

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThreads.cpp
# Opt level: O2

void __thiscall
xmrig::CudaThreads::CudaThreads
          (CudaThreads *this,vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  pointer pCVar1;
  CudaDevice *device;
  pointer this_00;
  
  (this->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar1 = (devices->super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (devices->super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1;
      this_00 = this_00 + 1) {
    CudaDevice::generate(this_00,this);
  }
  return;
}

Assistant:

xmrig::CudaThreads::CudaThreads(const std::vector<CudaDevice> &devices)
{
    for (const auto &device : devices) {
        device.generate(*this);
    }
}